

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall
SQCompilation::CodegenVisitor::visitFunctionDecl(CodegenVisitor *this,FunctionDecl *funcDecl)

{
  SQUnsignedInteger *pSVar1;
  uint uVar2;
  SQFuncState *pSVar3;
  ParamDecl **ppPVar4;
  Node *this_00;
  long lVar5;
  Block *pBVar6;
  SQFuncState *pSVar7;
  SQString *x;
  SQObjectPtr *obj;
  SQInteger SVar8;
  SQFunctionProto *pSVar9;
  long lVar10;
  long lVar11;
  Block *this_01;
  SQOptimizer opt;
  
  addLineNumber(this,(Statement *)funcDecl);
  pSVar3 = this->_childFs;
  pSVar7 = SQFuncState::PushChildState(this->_fs,this->_vm->_sharedstate);
  this->_childFs = pSVar7;
  opt.jumps._0_16_ = SQFuncState::CreateString(this->_fs,funcDecl->_name,-1);
  SQObjectPtr::operator=(&this->_childFs->_name,(SQObject *)&opt);
  x = SQString::Create(this->_vm->_sharedstate,funcDecl->_sourcename,-1);
  obj = SQObjectPtr::operator=(&this->_fs->_sourcename,x);
  SQObjectPtr::operator=(&this->_childFs->_sourcename,obj);
  pSVar7 = this->_childFs;
  pSVar7->_varparams = funcDecl->_vararg;
  opt.jumps._0_16_ = SQFuncState::CreateString(this->_fs,"this",-1);
  SQFuncState::AddParameter(pSVar7,(SQObject *)&opt);
  ppPVar4 = (funcDecl->_parameters)._vals;
  uVar2 = (funcDecl->_parameters)._size;
  lVar11 = 0;
  for (lVar10 = 0; (ulong)uVar2 << 3 != lVar10; lVar10 = lVar10 + 8) {
    this_00 = *(Node **)((long)ppPVar4 + lVar10);
    Node::visit<SQCompilation::CodegenVisitor>(this_00,this);
    lVar5._0_4_ = this_00[1]._coordinates.lineStart;
    lVar5._4_4_ = this_00[1]._coordinates.columnStart;
    if (lVar5 != 0) {
      pSVar7 = this->_childFs;
      SVar8 = SQFuncState::TopTarget(this->_fs);
      SQFuncState::AddDefaultParam(pSVar7,SVar8);
      lVar11 = lVar11 + 1;
    }
  }
  lVar10 = 0;
  if (0 < lVar11) {
    lVar10 = lVar11;
  }
  while (lVar10 != 0) {
    SQFuncState::PopTarget(this->_fs);
    lVar10 = lVar10 + -1;
  }
  pBVar6 = funcDecl->_body;
  this_01 = pBVar6;
  if ((long)*(int *)&pBVar6->field_0x8 != -1) {
    SQFuncState::AddLineInfos(this->_childFs,(long)*(int *)&pBVar6->field_0x8,this->_lineinfo,false)
    ;
    this_01 = funcDecl->_body;
  }
  pSVar7 = this->_childFs;
  this->_fs = pSVar7;
  this->_childFs = (SQFuncState *)0x0;
  Node::visit<SQCompilation::CodegenVisitor>((Node *)this_01,this);
  this->_childFs = pSVar7;
  this->_fs = pSVar7->_parent;
  SQFuncState::AddLineInfos(pSVar7,(long)*(int *)&pBVar6->field_0x10,this->_lineinfo,true);
  SQFuncState::AddInstruction(this->_childFs,_OP_RETURN,-1,0,0,0);
  pSVar7 = this->_childFs;
  if ((pSVar7->lang_features & 0x200) == 0) {
    SQOptimizer::SQOptimizer(&opt,pSVar7);
    SQOptimizer::optimize(&opt);
    sqvector<SQOptimizer::Jump,_unsigned_int>::~sqvector(&opt.jumps);
    pSVar7 = this->_childFs;
  }
  SQFuncState::SetStackSize(pSVar7,0);
  pSVar7 = this->_childFs;
  pSVar7->_hoistLevel = (long)funcDecl->_hoistingLevel;
  pSVar9 = SQFuncState::BuildProto(pSVar7);
  pSVar7 = this->_fs;
  opt.jumps._vals._0_5_ = 0x8002000;
  opt.jumps._alloc_ctx = (SQAllocContext)pSVar9;
  pSVar1 = &(pSVar9->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  sqvector<SQObjectPtr,_unsigned_int>::push_back(&pSVar7->_functions,(SQObjectPtr *)&opt);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&opt);
  SQFuncState::PopChildState(this->_fs);
  this->_childFs = pSVar3;
  pSVar3 = this->_fs;
  SVar8 = SQFuncState::PushTarget(pSVar3,-1);
  SQFuncState::AddInstruction
            (pSVar3,_OP_CLOSURE,SVar8,(ulong)((this->_fs->_functions)._size - 1),
             (ulong)funcDecl->_lambda,0);
  return;
}

Assistant:

void CodegenVisitor::visitFunctionDecl(FunctionDecl *funcDecl) {
    addLineNumber(funcDecl);

    SQFuncState *savedChildFsAtRoot = _childFs; // may be non-null when processing default argument that is declared as function/lambda
    _childFs = _fs->PushChildState(_ss(_vm));

    _childFs->_name = _fs->CreateString(funcDecl->name());
    _childFs->_sourcename = _fs->_sourcename = SQString::Create(_ss(_vm), funcDecl->sourceName());
    _childFs->_varparams = funcDecl->isVararg();

    SQInteger defparams = 0;

    _childFs->AddParameter(_fs->CreateString("this"));

    for (auto param : funcDecl->parameters()) {
        param->visit(this);
        if (param->hasDefaultValue()) {
            _childFs->AddDefaultParam(_fs->TopTarget());
            ++defparams;
        }
    }

    for (SQInteger n = 0; n < defparams; n++) {
        _fs->PopTarget();
    }

    Block *body = funcDecl->body();
    SQInteger startLine = body->lineStart();
    if (startLine != -1) {
        _childFs->AddLineInfos(startLine, _lineinfo, false);
    }

    {
        assert(_childFs->_parent == _fs);
        SQFuncState *savedChildFsAtBody = _childFs;
        _fs = _childFs;
        _childFs = NULL;

        funcDecl->body()->visit(this);

        _childFs = savedChildFsAtBody;
        _fs = _childFs->_parent;
    }

    _childFs->AddLineInfos(body->lineEnd(), _lineinfo, true);
    _childFs->AddInstruction(_OP_RETURN, -1);

    if (!(_childFs->lang_features & LF_DISABLE_OPTIMIZER)) {
        SQOptimizer opt(*_childFs);
        opt.optimize();
    }

    _childFs->SetStackSize(0);
    _childFs->_hoistLevel = funcDecl->hoistingLevel();
    SQFunctionProto *funcProto = _childFs->BuildProto();

    _fs->_functions.push_back(funcProto);

    _fs->PopChildState();
    _childFs = savedChildFsAtRoot;

    _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, funcDecl->isLambda() ? 1 : 0);
}